

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void delete_field(List *code,int field_number,int val)

{
  int val_local;
  int field_number_local;
  List *code_local;
  
  if (code != (List *)0x0) {
    if ((((((code->token).type == TOK_DOLLAR_DATA_REGISTER) ||
          ((code->token).type == TOK_DOLLAR_ADDRESS_REGISTER)) ||
         ((code->token).type == TOK_DOLLAR_GENERAL_REGISTER)) ||
        (((code->token).type == TOK_DOLLAR_AMODE ||
         ((code->token).type == TOK_DOLLAR_REVERSED_AMODE)))) ||
       (((code->token).type == TOK_DOLLAR_NUMBER ||
        (((code->token).type == TOK_DOLLAR_AMODE_PTR ||
         ((code->token).type == TOK_DOLLAR_REVERSED_AMODE_PTR)))))) {
      if ((uint)(code->token).u.reginfo.which == field_number) {
        if ((code->token).type == TOK_DOLLAR_NUMBER) {
          (code->token).type = TOK_NUMBER;
          (code->token).u = (anon_union_8_7_0ba269be_for_u)(long)val;
        }
        else {
          parse_error(code,"Deleting field that still exists!\n");
        }
      }
      else if (field_number < (int)(uint)(code->token).u.reginfo.which) {
        (code->token).u.reginfo.which = (code->token).u.reginfo.which + 0xff;
      }
    }
    delete_field(code->car,field_number,val);
    delete_field(code->cdr,field_number,val);
  }
  return;
}

Assistant:

static void
delete_field (List *code, int field_number, int val)
{
  if (code == NULL)
    return;
  if (IS_DOLLAR_TOKEN (code->token.type))
    {
      if (code->token.u.dollarinfo.which == field_number)
	{
	  if (code->token.type != TOK_DOLLAR_NUMBER)
	    parse_error (code, "Deleting field that still exists!\n");
	  else
	    {
	      code->token.type = TOK_NUMBER;
	      code->token.u.n = val;
	    }
	}
      else if (code->token.u.dollarinfo.which > field_number)
	--code->token.u.dollarinfo.which;
    }

  delete_field (code->car, field_number, val);
  delete_field (code->cdr, field_number, val);
}